

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxPortFactory.cpp
# Opt level: O2

void __thiscall LinuxPortFactory::~LinuxPortFactory(LinuxPortFactory *this)

{
  (this->super_PortFactoryBase)._vptr_PortFactoryBase =
       (_func_int **)&PTR__LinuxPortFactory_00117c10;
  if ((DIR *)this->_dir != (DIR *)0x0) {
    closedir((DIR *)this->_dir);
  }
  std::__cxx11::string::~string((string *)&this->_empty);
  return;
}

Assistant:

LinuxPortFactory::~LinuxPortFactory()
{
    if (_dir)
        closedir(_dir);
}